

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::PoissonRegressionLoss::dim_forward
          (Dim *__return_storage_ptr__,PoissonRegressionLoss *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  Dim *this_00;
  pointer pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  ostream *os;
  invalid_argument *this_01;
  string local_1b0 [32];
  ostringstream s;
  
  this_00 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)this_00 == 0x24) {
    uVar5 = Dim::size(this_00);
    if (uVar5 == 1) {
      pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __return_storage_ptr__->bd = pDVar1->bd;
      uVar2 = *(undefined8 *)(pDVar1->d + 2);
      uVar3 = *(undefined8 *)(pDVar1->d + 4);
      uVar4 = *(undefined8 *)(pDVar1->d + 6);
      *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar1->d;
      *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar2;
      *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar3;
      *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar4;
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  os = std::operator<<((ostream *)&s,"Bad input dimensions in PoissonRegressionLoss: ");
  operator<<(os,xs);
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_01,local_1b0);
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim PoissonRegressionLoss::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || xs[0].size() != 1) {
    ostringstream s; s << "Bad input dimensions in PoissonRegressionLoss: " << xs;
    throw std::invalid_argument(s.str());
  }
  return xs[0];
}